

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_GlaAbsCount(Ga2_Man_t *p,int fRo,int fAnd)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  int fAnd_local;
  int fRo_local;
  Ga2_Man_t *p_local;
  
  local_28 = 0;
  if (fRo == 0) {
    if (fAnd == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                    ,0x54a,"int Ga2_GlaAbsCount(Ga2_Man_t *, int, int)");
    }
    local_24 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vAbs);
      bVar3 = false;
      if (local_24 < iVar2) {
        pGVar1 = p->pGia;
        iVar2 = Vec_IntEntry(p->vAbs,local_24);
        _Counter = Gia_ManObj(pGVar1,iVar2);
        bVar3 = _Counter != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar2 = Gia_ObjIsAnd(_Counter);
      local_28 = iVar2 + local_28;
      local_24 = local_24 + 1;
    }
  }
  else {
    local_24 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vAbs);
      bVar3 = false;
      if (local_24 < iVar2) {
        pGVar1 = p->pGia;
        iVar2 = Vec_IntEntry(p->vAbs,local_24);
        _Counter = Gia_ManObj(pGVar1,iVar2);
        bVar3 = _Counter != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      iVar2 = Gia_ObjIsRo(p->pGia,_Counter);
      local_28 = iVar2 + local_28;
      local_24 = local_24 + 1;
    }
  }
  return local_28;
}

Assistant:

int Ga2_GlaAbsCount( Ga2_Man_t * p, int fRo, int fAnd )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    if ( fRo )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsRo(p->pGia, pObj);
    else if ( fAnd )
        Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
            Counter += Gia_ObjIsAnd(pObj);
    else assert( 0 );
    return Counter;
}